

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_setgid_fails(void)

{
  __uid_t _Var1;
  int iVar2;
  passwd *ppVar3;
  undefined8 uVar4;
  uv_loop_t *loop;
  char *__format;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  int64_t eval_b;
  int64_t eval_a;
  
  _Var1 = getuid();
  if (_Var1 == 0) {
    ppVar3 = getpwnam("nobody");
    if (ppVar3 == (passwd *)0x0) {
      pcVar6 = "!=";
      eval_b = 0;
      pcVar8 = "!=";
      eval_a = 0;
      pcVar7 = "NULL";
      __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
      pcVar5 = "pw";
      uVar4 = 0x61b;
      goto LAB_0017b4d4;
    }
    iVar2 = setgid(ppVar3->pw_gid);
    eval_a = (int64_t)iVar2;
    eval_b = 0;
    if (eval_a == 0) {
      iVar2 = setuid(ppVar3->pw_uid);
      eval_a = (int64_t)iVar2;
      eval_b = 0;
      if (eval_a == 0) goto LAB_0017b244;
      pcVar7 = "0";
      pcVar5 = "setuid(pw->pw_uid)";
      uVar4 = 0x61d;
    }
    else {
      pcVar7 = "0";
      pcVar5 = "setgid(pw->pw_gid)";
      uVar4 = 0x61c;
    }
  }
  else {
LAB_0017b244:
    init_process_options("spawn_helper1",fail_cb);
    options.flags._0_1_ = (byte)options.flags | 2;
    options.gid = 0;
    uVar4 = uv_default_loop();
    iVar2 = uv_spawn(uVar4,&process,&options);
    eval_a = (int64_t)iVar2;
    eval_b = -1;
    if (eval_a == -1) {
      uVar4 = uv_default_loop();
      iVar2 = uv_run(uVar4,0);
      eval_a = (int64_t)iVar2;
      eval_b = 0;
      if (eval_a == 0) {
        eval_a = (int64_t)close_cb_called;
        eval_b = 0;
        if (eval_a == 0) {
          loop = (uv_loop_t *)uv_default_loop();
          close_loop(loop);
          eval_a = 0;
          uVar4 = uv_default_loop();
          iVar2 = uv_loop_close(uVar4);
          eval_b = (int64_t)iVar2;
          if (eval_b == 0) {
            uv_library_shutdown();
            return 0;
          }
          pcVar7 = "uv_loop_close(uv_default_loop())";
          pcVar5 = "0";
          uVar4 = 0x639;
        }
        else {
          pcVar7 = "0";
          pcVar5 = "close_cb_called";
          uVar4 = 0x637;
        }
      }
      else {
        pcVar7 = "0";
        pcVar5 = "r";
        uVar4 = 0x635;
      }
    }
    else {
      pcVar7 = "UV_EPERM";
      pcVar5 = "r";
      uVar4 = 0x631;
    }
  }
  pcVar6 = "==";
  __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
  pcVar8 = "==";
LAB_0017b4d4:
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
          ,uVar4,pcVar5,pcVar6,pcVar7,eval_a,pcVar8,eval_b);
  abort();
}

Assistant:

TEST_IMPL(spawn_setgid_fails) {
  int r;

  /* if root, become nobody. */
  /* On IBMi PASE, there is no nobody user. */
#ifndef __PASE__
  uv_uid_t uid = getuid();
  if (uid == 0) {
    struct passwd* pw;
    pw = getpwnam("nobody");
    ASSERT_NOT_NULL(pw);
    ASSERT_OK(setgid(pw->pw_gid));
    ASSERT_OK(setuid(pw->pw_uid));
  }
#endif  /* !__PASE__ */

  init_process_options("spawn_helper1", fail_cb);

  options.flags |= UV_PROCESS_SETGID;
  /* On IBMi PASE, there is no root user. User may grant 
   * root-like privileges, including setting gid to 0.
   */
#if defined(__MVS__) || defined(__PASE__)
  options.gid = -1;
#else
  options.gid = 0;
#endif

  r = uv_spawn(uv_default_loop(), &process, &options);
#if defined(__CYGWIN__) || defined(__MVS__)
  ASSERT_EQ(r, UV_EINVAL);
#else
  ASSERT_EQ(r, UV_EPERM);
#endif

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_OK(close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}